

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGhsMultiGenerator::VisitTarget
          (cmGlobalGhsMultiGenerator *this,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *temp,set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                *perm,
          vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *order,
          cmGeneratorTarget *ti)

{
  cmGeneratorTarget *order_00;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *perm_00;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *temp_00;
  bool bVar1;
  TargetDependSet *targets;
  reference this_00;
  cmGeneratorTarget *ti_00;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar2;
  cmTargetDepend *di;
  iterator __end3;
  iterator __begin3;
  OrderedTargetDependSet *__range3;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  OrderedTargetDependSet sortedTargets;
  _Self local_48;
  _Self local_40;
  cmGeneratorTarget *local_38;
  cmGeneratorTarget *ti_local;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *order_local;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *perm_local;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *temp_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  local_38 = ti;
  ti_local = (cmGeneratorTarget *)order;
  order_local = (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                perm;
  perm_local = temp;
  temp_local = (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                *)this;
  local_40._M_node =
       (_Base_ptr)
       std::
       set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
       ::find(perm,&local_38);
  local_48._M_node =
       (_Base_ptr)
       std::
       set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
       ::end((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              *)order_local);
  bVar1 = std::operator==(&local_40,&local_48);
  if (bVar1) {
    pVar2 = std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert(perm_local,&local_38);
    sortedTargets.
    super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pVar2.first._M_node;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      this_local._7_1_ = 1;
    }
    else {
      targets = cmGlobalGenerator::GetTargetDirectDepends(&this->super_cmGlobalGenerator,local_38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
      OrderedTargetDependSet::OrderedTargetDependSet
                ((OrderedTargetDependSet *)local_b0,targets,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
      __end3 = std::
               multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
               ::begin((multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
                        *)local_b0);
      di = (cmTargetDepend *)
           std::
           multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
           ::end((multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
                  *)local_b0);
      while( true ) {
        bVar1 = std::operator!=(&__end3,(_Self *)&di);
        if (!bVar1) break;
        this_00 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end3);
        temp_00 = perm_local;
        perm_00 = order_local;
        order_00 = ti_local;
        ti_00 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(this_00);
        bVar1 = VisitTarget(this,temp_00,
                            (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                             *)perm_00,
                            (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                             *)order_00,ti_00);
        if (bVar1) {
          this_local._7_1_ = 1;
          goto LAB_00382fe8;
        }
        std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end3);
      }
      std::
      set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                *)order_local,&local_38);
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
                ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                 ti_local,&local_38);
      this_local._7_1_ = 0;
LAB_00382fe8:
      OrderedTargetDependSet::~OrderedTargetDependSet((OrderedTargetDependSet *)local_b0);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalGhsMultiGenerator::VisitTarget(
  std::set<cmGeneratorTarget const*>& temp,
  std::set<cmGeneratorTarget const*>& perm,
  std::vector<cmGeneratorTarget const*>& order, cmGeneratorTarget const* ti)
{
  /* check if permanent mark is set*/
  if (perm.find(ti) == perm.end()) {
    /* set temporary mark; check if revisit*/
    if (temp.insert(ti).second) {
      /* sort targets lexicographically to ensure that nodes are always visited
       * in the same order */
      OrderedTargetDependSet sortedTargets(this->GetTargetDirectDepends(ti),
                                           "");
      for (auto& di : sortedTargets) {
        if (this->VisitTarget(temp, perm, order, di)) {
          return true;
        }
      }
      /* mark as complete; insert into beginning of list*/
      perm.insert(ti);
      order.push_back(ti);
      return false;
    }
    /* revisiting item - not a DAG */
    return true;
  }
  /* already complete */
  return false;
}